

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vtls.c
# Opt level: O1

ssize_t ssl_cf_recv(Curl_cfilter *cf,Curl_easy *data,char *buf,size_t len,CURLcode *err)

{
  undefined8 uVar1;
  curl_trc_feat *pcVar2;
  ssize_t sVar3;
  
  uVar1 = *(undefined8 *)((long)cf->ctx + 0x38);
  *(Curl_easy **)((long)cf->ctx + 0x38) = data;
  *err = CURLE_OK;
  sVar3 = (*Curl_ssl->recv_plain)(cf,data,buf,len,err);
  if (sVar3 == 0) {
    *err = CURLE_OK;
  }
  if ((data != (Curl_easy *)0x0) && (((data->set).field_0x8cd & 0x10) != 0)) {
    pcVar2 = (data->state).feat;
    if (pcVar2 == (curl_trc_feat *)0x0) {
      if (cf == (Curl_cfilter *)0x0) goto LAB_00173299;
    }
    else if ((cf == (Curl_cfilter *)0x0) || (pcVar2->log_level < 1)) goto LAB_00173299;
    if (0 < cf->cft->log_level) {
      Curl_trc_cf_infof(data,cf,"cf_recv(len=%zu) -> %zd, %d",len,sVar3,(ulong)*err);
    }
  }
LAB_00173299:
  *(undefined8 *)((long)cf->ctx + 0x38) = uVar1;
  return sVar3;
}

Assistant:

static ssize_t ssl_cf_recv(struct Curl_cfilter *cf,
                           struct Curl_easy *data, char *buf, size_t len,
                           CURLcode *err)
{
  struct cf_call_data save;
  ssize_t nread;

  CF_DATA_SAVE(save, cf, data);
  *err = CURLE_OK;
  nread = Curl_ssl->recv_plain(cf, data, buf, len, err);
  if(nread > 0) {
    DEBUGASSERT((size_t)nread <= len);
  }
  else if(nread == 0) {
    /* eof */
    *err = CURLE_OK;
  }
  CURL_TRC_CF(data, cf, "cf_recv(len=%zu) -> %zd, %d", len,
              nread, *err);
  CF_DATA_RESTORE(cf, save);
  return nread;
}